

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O3

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetStackFrame(cmDebuggerThread *this,int64_t frameId)

{
  pointer pcVar1;
  iterator iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  key_type_conflict1 local_28;
  
  local_38._M_device = (mutex_type *)(frameId + 0x78);
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  iVar2 = std::
          _Hashtable<long,_std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(frameId + 0x40),&local_28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    this->Id = 0;
    (this->Name)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    this->Id = *(int64_t *)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
                       ._M_cur + 0x10);
    pcVar1 = *(pointer *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
                     ._M_cur + 0x18);
    (this->Name)._M_dataplus._M_p = pcVar1;
    if (pcVar1 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetStackFrame(
  int64_t frameId)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameMap.find(frameId);

  if (it == FrameMap.end()) {
    return {};
  }

  return it->second;
}